

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression(xpath_parser *this,int limit)

{
  size_t sVar1;
  ulong uVar2;
  xpath_ast_node *lhs;
  xpath_ast_node *n;
  size_t old_depth;
  int limit_local;
  xpath_parser *this_local;
  
  sVar1 = this->_depth;
  uVar2 = this->_depth + 1;
  this->_depth = uVar2;
  if (uVar2 < 0x401) {
    lhs = parse_path_or_unary_expression(this);
    if (lhs == (xpath_ast_node *)0x0) {
      this_local = (xpath_parser *)0x0;
    }
    else {
      this_local = (xpath_parser *)parse_expression_rec(this,lhs,limit);
      this->_depth = sVar1;
    }
  }
  else {
    this_local = (xpath_parser *)error_rec(this);
  }
  return (xpath_ast_node *)this_local;
}

Assistant:

xpath_ast_node* parse_expression(int limit = 0)
		{
			size_t old_depth = _depth;

			if (++_depth > xpath_ast_depth_limit)
				return error_rec();

			xpath_ast_node* n = parse_path_or_unary_expression();
			if (!n) return NULL;

			n = parse_expression_rec(n, limit);

			_depth = old_depth;

			return n;
		}